

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roundtrip.cpp
# Opt level: O2

bool operator==(Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *x,Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *y)

{
  __type _Var1;
  
  if (x->a == y->a) {
    _Var1 = std::operator==(&x->_b,&y->_b);
    return _Var1;
  }
  return false;
}

Assistant:

bool operator==(const Pair& x, const Pair& y)
  {
    return x.a == y.a && x._b == y._b;
  }